

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normalizer2impl.cpp
# Opt level: O1

UBool __thiscall
icu_63::Normalizer2Impl::compose
          (Normalizer2Impl *this,UChar *src,UChar *limit,UBool onlyContiguous,UBool doCompose,
          ReorderingBuffer *buffer,UErrorCode *errorCode)

{
  ushort *puVar1;
  UChar UVar2;
  ushort uVar3;
  UChar UVar4;
  UCPTrie *pUVar5;
  void *pvVar6;
  byte bVar7;
  UBool UVar8;
  byte bVar9;
  char cVar10;
  byte bVar11;
  UChar UVar12;
  int iVar13;
  UChar *pUVar14;
  int32_t iVar15;
  UChar *prevSrc;
  ushort uVar16;
  UChar *pUVar17;
  UChar *pUVar18;
  byte bVar19;
  uint uVar20;
  uint uVar21;
  UChar *pUVar22;
  long lVar23;
  bool bVar24;
  UChar *local_68;
  
  UVar2 = this->minCompNoMaybeCP;
  pUVar14 = src;
  local_68 = src;
  if (limit == (UChar *)0x0) {
    lVar23 = 2;
    pUVar22 = src + -2;
    do {
      pUVar14 = pUVar22;
      pUVar22 = pUVar14 + 1;
      lVar23 = lVar23 + -2;
      if (pUVar14[2] == L'\0') break;
    } while ((ushort)pUVar14[2] < (ushort)UVar2);
    pUVar14 = pUVar14 + 2;
    if (lVar23 != 0 && doCompose != '\0') {
      ReorderingBuffer::appendZeroCC(buffer,src,pUVar14,errorCode);
    }
    if (U_ZERO_ERROR < *errorCode) {
      return '\0';
    }
    limit = u_strchr_63(pUVar14,L'\0');
    local_68 = src;
    if ((lVar23 != 0) &&
       (UVar8 = hasCompBoundaryAfter(this,(uint)(ushort)*pUVar22,onlyContiguous), local_68 = pUVar14
       , UVar8 == '\0')) {
      ReorderingBuffer::removeSuffix(buffer,1);
      pUVar14 = pUVar22;
      local_68 = pUVar22;
    }
  }
  bVar7 = (doCompose != '\0') * '\x05' + 1;
  bVar11 = bVar7;
LAB_0017a289:
  do {
    while( true ) {
      pUVar22 = pUVar14;
      if (pUVar22 == limit) {
        bVar9 = 1;
        if ((doCompose != '\0') && (local_68 != limit)) {
          ReorderingBuffer::appendZeroCC(buffer,local_68,limit,errorCode);
        }
        bVar11 = 1;
        pUVar14 = pUVar22;
        goto LAB_0017a3f9;
      }
      UVar12 = *pUVar22;
      uVar20 = (uint)(ushort)UVar12;
      if ((ushort)UVar2 <= (ushort)UVar12) break;
LAB_0017a2c8:
      pUVar14 = pUVar22 + 1;
    }
    pUVar5 = this->normTrie;
    pvVar6 = (pUVar5->data).ptr0;
    uVar16 = *(ushort *)
              ((long)pvVar6 +
              (ulong)(((ushort)UVar12 & 0x3f) + (uint)pUVar5->index[(ushort)UVar12 >> 6]) * 2);
    uVar21 = (uint)uVar16;
    if (uVar16 < this->minNoNo) goto LAB_0017a2c8;
    pUVar14 = pUVar22 + 1;
    if (((ushort)UVar12 & 0xfc00) == 0xd800) {
      bVar24 = true;
      uVar21 = (uint)uVar16;
      if ((pUVar14 != limit) && (((ushort)*pUVar14 & 0xfc00) == 0xdc00)) {
        uVar20 = (uint)(ushort)UVar12 * 0x400 + (uint)(ushort)*pUVar14 + 0xfca02400;
        if ((int)uVar20 < pUVar5->highStart) {
          iVar13 = ucptrie_internalSmallIndex_63(pUVar5,uVar20);
        }
        else {
          iVar13 = pUVar5->dataLength + -2;
        }
        pUVar14 = pUVar22 + 2;
        uVar16 = *(ushort *)((long)pvVar6 + (long)iVar13 * 2);
        uVar21 = (uint)uVar16;
        bVar24 = uVar16 < this->minNoNo;
      }
      if (bVar24) goto LAB_0017a289;
    }
    uVar16 = (ushort)uVar21;
    if (uVar16 < this->minMaybeYes) {
      if (doCompose == '\0') {
        bVar9 = 1;
        bVar11 = 0;
      }
      else {
        uVar3 = this->limitNoNo;
        if (uVar3 <= uVar16) {
          if ((uVar21 & 1) == 0) {
LAB_0017a4f3:
            UVar8 = hasCompBoundaryBefore(this,pUVar14,limit);
            if (UVar8 == '\0') goto LAB_0017a8ee;
          }
          else if ((onlyContiguous != '\0') && (uVar16 != 1)) {
            if (uVar16 < uVar3) {
              bVar24 = *(ushort *)((long)this->extraData + (ulong)(uVar21 & 0xfffe)) < 0x200;
            }
            else {
              bVar24 = (uVar16 & 6) < 3;
            }
            if (!bVar24) goto LAB_0017a4f3;
          }
          if ((local_68 == pUVar22) ||
             (UVar8 = ReorderingBuffer::appendZeroCC(buffer,local_68,pUVar22,errorCode),
             UVar8 != '\0')) {
            cVar10 = ReorderingBuffer::append
                               (buffer,(uVar20 + (uVar21 >> 3)) - (uint)this->centerNoNoDelta,'\0',
                                errorCode);
LAB_0017ac8d:
            if (cVar10 != '\0') {
              local_68 = pUVar14;
            }
            bVar9 = cVar10 == '\0' ^ 3;
            goto LAB_0017a3f9;
          }
          goto LAB_0017acab;
        }
        if (uVar16 < this->minNoNoCompBoundaryBefore) {
          if ((uVar21 & 1) == 0) {
LAB_0017a3d0:
            UVar8 = hasCompBoundaryBefore(this,pUVar14,limit);
            if (UVar8 == '\0') goto LAB_0017a8ee;
          }
          else if ((onlyContiguous != '\0') && (uVar16 != 1)) {
            if (uVar16 < uVar3) {
              bVar24 = *(ushort *)((long)this->extraData + (ulong)(uVar21 & 0xfffe)) < 0x200;
            }
            else {
              bVar24 = (uVar16 & 6) < 3;
            }
            if (!bVar24) goto LAB_0017a3d0;
          }
          if ((local_68 == pUVar22) ||
             (UVar8 = ReorderingBuffer::appendZeroCC(buffer,local_68,pUVar22,errorCode),
             UVar8 != '\0')) {
            puVar1 = (ushort *)((long)this->extraData + (ulong)(uVar21 & 0xfffe));
            cVar10 = ReorderingBuffer::appendZeroCC
                               (buffer,(UChar *)(puVar1 + 1),
                                (UChar *)((long)this->extraData +
                                         (ulong)(*puVar1 & 0x1f) * 2 + (ulong)(uVar21 & 0xfffe) + 2)
                                ,errorCode);
            goto LAB_0017ac8d;
          }
          goto LAB_0017acab;
        }
        if ((uVar16 < this->minNoNoEmpty) ||
           ((UVar8 = hasCompBoundaryBefore(this,pUVar14,limit), UVar8 == '\0' &&
            (UVar8 = hasCompBoundaryAfter(this,local_68,pUVar22,onlyContiguous), UVar8 == '\0'))))
        goto LAB_0017a8ee;
        if ((local_68 == pUVar22) ||
           (UVar8 = ReorderingBuffer::appendZeroCC(buffer,local_68,pUVar22,errorCode), UVar8 != '\0'
           )) {
          bVar9 = 3;
          local_68 = pUVar14;
        }
        else {
          bVar9 = 2;
        }
      }
    }
    else {
      if ((uVar21 == 0xfe00) && (local_68 != pUVar22)) {
        pUVar18 = pUVar22 + -1;
        UVar12 = pUVar22[-1];
        if ((int)uVar20 < 0x11a7) {
          if ((ushort)(UVar12 + L'\xef00') < 0x13) {
            if (doCompose == '\0') {
LAB_0017a645:
              bVar9 = 1;
              bVar11 = 0;
              goto LAB_0017a8e5;
            }
            if ((pUVar14 == limit) || (0x1a < (ushort)(*pUVar14 + L'\xee58'))) {
              UVar8 = hasCompBoundaryBefore(this,pUVar14,limit);
              iVar13 = -(uint)(UVar8 == '\0');
            }
            else {
              iVar13 = (ushort)*pUVar14 - 0x11a7;
              pUVar14 = pUVar14 + 1;
            }
            if (-1 < iVar13) {
              if ((local_68 == pUVar18) ||
                 (UVar8 = ReorderingBuffer::appendZeroCC(buffer,local_68,pUVar18,errorCode),
                 UVar8 != '\0')) {
                UVar12 = ((short)uVar20 + (UVar12 + L'\xef00') * 0x15) * 0x1c + (short)iVar13 +
                         L'앤';
                goto LAB_0017a89a;
              }
LAB_0017aa62:
              bVar9 = 2;
              pUVar22 = pUVar18;
              goto LAB_0017a8e5;
            }
          }
          bVar9 = 0;
        }
        else {
          bVar9 = 0;
          if (((ushort)UVar12 - 0xac00 < 0x2ba4) && (((ushort)UVar12 - 0xac00) % 0x1c == 0)) {
            if (doCompose == '\0') goto LAB_0017a645;
            if ((local_68 != pUVar18) &&
               (UVar8 = ReorderingBuffer::appendZeroCC(buffer,local_68,pUVar18,errorCode),
               UVar8 == '\0')) goto LAB_0017aa62;
            UVar12 = UVar12 + (short)uVar20 + L'\xee59';
LAB_0017a89a:
            UVar8 = ReorderingBuffer::appendBMP(buffer,UVar12,'\0',errorCode);
            if (UVar8 != '\0') {
              local_68 = pUVar14;
            }
            bVar9 = UVar8 == '\0' ^ 3;
            pUVar22 = pUVar18;
          }
        }
LAB_0017a8e5:
        if (bVar9 != 0) goto LAB_0017a3f9;
      }
      else if (0xfe00 < uVar21) {
        uVar21 = uVar21 >> 1;
        if ((onlyContiguous == '\0') ||
           (bVar9 = getPreviousTrailCC(this,local_68,pUVar22), bVar9 <= (byte)uVar21)) {
          do {
            if (pUVar14 == limit) {
              bVar11 = 1;
              bVar9 = 1;
              if (doCompose != '\0') {
                ReorderingBuffer::appendZeroCC(buffer,local_68,limit,errorCode);
              }
              goto LAB_0017a7ff;
            }
            pUVar18 = pUVar14 + 1;
            UVar12 = *pUVar14;
            if ((UVar12 & 0xf800U) == 0xd800) {
              if (((((ushort)UVar12 >> 10 & 1) == 0) && (pUVar18 != limit)) &&
                 (UVar4 = *pUVar18, (UVar4 & 0xfc00U) == 0xdc00)) {
                pUVar18 = pUVar14 + 2;
                iVar13 = (uint)(ushort)UVar12 * 0x400 + (uint)(ushort)UVar4 + -0x35fdc00;
                pUVar5 = this->normTrie;
                if (iVar13 < pUVar5->highStart) {
                  iVar13 = ucptrie_internalSmallIndex_63(pUVar5,iVar13);
                }
                else {
                  iVar13 = pUVar5->dataLength + -2;
                }
              }
              else {
                iVar13 = this->normTrie->dataLength + -1;
              }
            }
            else {
              iVar13 = ((ushort)UVar12 & 0x3f) + (uint)this->normTrie->index[(ushort)UVar12 >> 6];
            }
            uVar3 = *(ushort *)((long)(this->normTrie->data).ptr0 + (long)iVar13 * 2);
            pUVar17 = pUVar14;
            bVar9 = 6;
            if (0xfe01 < uVar3) {
              uVar20 = (uint)(uVar3 >> 1);
              bVar19 = (byte)uVar21;
              pUVar17 = pUVar18;
              uVar21 = uVar20;
              bVar9 = 0;
              if (((byte)(uVar3 >> 1) < bVar19) &&
                 (pUVar17 = pUVar14, bVar9 = bVar7, doCompose == '\0')) {
                bVar11 = 0;
              }
            }
            pUVar14 = pUVar17;
          } while (bVar9 == 0);
          if (bVar9 == 6) {
            if (this->minNoNoCompNoMaybeCC <= uVar3) {
              bVar9 = 0;
              if ((uVar3 < this->limitNoNo) || (bVar9 = 0, this->minMaybeYes <= uVar3))
              goto LAB_0017a7ff;
            }
            if (uVar3 < this->minNoNo) {
              pUVar14 = pUVar18;
            }
            bVar9 = 3;
          }
LAB_0017a7ff:
          if (bVar9 != 0) goto LAB_0017a8e5;
        }
        else if (doCompose == '\0') {
          bVar9 = 1;
          bVar11 = 0;
          goto LAB_0017a8e5;
        }
        bVar9 = 0;
        goto LAB_0017a8e5;
      }
LAB_0017a8ee:
      pUVar18 = pUVar22;
      if (((local_68 != pUVar22) && (this->minNoNoCompNoMaybeCC <= uVar16)) &&
         ((uVar16 < this->limitNoNo || (this->minMaybeYes <= uVar16)))) {
        pUVar17 = pUVar22 + -1;
        UVar12 = pUVar22[-1];
        if ((UVar12 & 0xf800U) == 0xd800) {
          if ((pUVar17 == local_68 || ((ushort)UVar12 >> 10 & 1) == 0) ||
             ((pUVar22[-2] & 0xfc00U) != 0xd800)) {
            iVar13 = this->normTrie->dataLength + -1;
          }
          else {
            pUVar17 = pUVar22 + -2;
            iVar13 = (uint)(ushort)UVar12 + (uint)(ushort)pUVar22[-2] * 0x400 + -0x35fdc00;
            pUVar5 = this->normTrie;
            if (iVar13 < pUVar5->highStart) {
              iVar13 = ucptrie_internalSmallIndex_63(pUVar5,iVar13);
            }
            else {
              iVar13 = pUVar5->dataLength + -2;
            }
          }
        }
        else {
          iVar13 = ((ushort)UVar12 & 0x3f) + (uint)this->normTrie->index[(ushort)UVar12 >> 6];
        }
        uVar16 = *(ushort *)((long)(this->normTrie->data).ptr0 + (long)iVar13 * 2);
        bVar24 = (uVar16 & 1) == 0;
        if (bVar24) {
          pUVar18 = pUVar17;
        }
        if (!bVar24 && onlyContiguous != '\0') {
          bVar24 = true;
          if (uVar16 != 1) {
            if (uVar16 < this->limitNoNo) {
              bVar24 = *(ushort *)((long)this->extraData + (ulong)(uVar16 & 0xfffffffe)) < 0x200;
            }
            else {
              bVar24 = (uVar16 & 6) < 3;
            }
          }
          pUVar18 = pUVar22;
          if (!bVar24) {
            pUVar18 = pUVar17;
          }
        }
      }
      if (((doCompose == '\0') || (local_68 == pUVar18)) ||
         (UVar8 = ReorderingBuffer::appendZeroCC(buffer,local_68,pUVar18,errorCode), UVar8 != '\0'))
      {
        pUVar22 = buffer->limit;
        pUVar17 = buffer->start;
        decomposeShort(this,pUVar18,pUVar14,'\0',onlyContiguous,buffer,errorCode);
        pUVar14 = decomposeShort(this,pUVar14,limit,'\x01',onlyContiguous,buffer,errorCode);
        bVar9 = 2;
        if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
          if ((long)pUVar14 - (long)pUVar18 < 0xffffffff) {
            recompose(this,buffer,(int32_t)((ulong)((long)pUVar22 - (long)pUVar17) >> 1),
                      onlyContiguous);
            if (doCompose == '\0') {
              UVar8 = ReorderingBuffer::equals(buffer,pUVar18,pUVar14);
              if (UVar8 == '\0') {
                bVar9 = 1;
                bVar11 = 0;
              }
              else {
                buffer->limit = buffer->start;
                buffer->reorderStart = buffer->start;
                iVar15 = 0x1b;
                if (((buffer->str->fUnion).fStackFields.fLengthAndFlags & 2U) == 0) {
                  iVar15 = (buffer->str->fUnion).fFields.fCapacity;
                }
                buffer->remainingCapacity = iVar15;
                buffer->lastCC = '\0';
                bVar9 = 0;
                local_68 = pUVar14;
              }
            }
            else {
              bVar9 = 0;
              local_68 = pUVar14;
            }
          }
          else {
            *errorCode = U_INDEX_OUTOFBOUNDS_ERROR;
            bVar11 = 1;
            bVar9 = 1;
          }
        }
      }
      else {
LAB_0017acab:
        bVar9 = 2;
      }
    }
LAB_0017a3f9:
    if ((bVar9 != 0) && (bVar9 != 3)) {
      if (bVar9 == 2) {
        bVar11 = 1;
      }
      return bVar11;
    }
  } while( true );
}

Assistant:

UBool
Normalizer2Impl::compose(const UChar *src, const UChar *limit,
                         UBool onlyContiguous,
                         UBool doCompose,
                         ReorderingBuffer &buffer,
                         UErrorCode &errorCode) const {
    const UChar *prevBoundary=src;
    UChar32 minNoMaybeCP=minCompNoMaybeCP;
    if(limit==NULL) {
        src=copyLowPrefixFromNulTerminated(src, minNoMaybeCP,
                                           doCompose ? &buffer : NULL,
                                           errorCode);
        if(U_FAILURE(errorCode)) {
            return FALSE;
        }
        limit=u_strchr(src, 0);
        if (prevBoundary != src) {
            if (hasCompBoundaryAfter(*(src-1), onlyContiguous)) {
                prevBoundary = src;
            } else {
                buffer.removeSuffix(1);
                prevBoundary = --src;
            }
        }
    }

    for (;;) {
        // Fast path: Scan over a sequence of characters below the minimum "no or maybe" code point,
        // or with (compYes && ccc==0) properties.
        const UChar *prevSrc;
        UChar32 c = 0;
        uint16_t norm16 = 0;
        for (;;) {
            if (src == limit) {
                if (prevBoundary != limit && doCompose) {
                    buffer.appendZeroCC(prevBoundary, limit, errorCode);
                }
                return TRUE;
            }
            if( (c=*src)<minNoMaybeCP ||
                isCompYesAndZeroCC(norm16=UCPTRIE_FAST_BMP_GET(normTrie, UCPTRIE_16, c))
            ) {
                ++src;
            } else {
                prevSrc = src++;
                if(!U16_IS_LEAD(c)) {
                    break;
                } else {
                    UChar c2;
                    if(src!=limit && U16_IS_TRAIL(c2=*src)) {
                        ++src;
                        c=U16_GET_SUPPLEMENTARY(c, c2);
                        norm16=UCPTRIE_FAST_SUPP_GET(normTrie, UCPTRIE_16, c);
                        if(!isCompYesAndZeroCC(norm16)) {
                            break;
                        }
                    }
                }
            }
        }
        // isCompYesAndZeroCC(norm16) is false, that is, norm16>=minNoNo.
        // The current character is either a "noNo" (has a mapping)
        // or a "maybeYes" (combines backward)
        // or a "yesYes" with ccc!=0.
        // It is not a Hangul syllable or Jamo L because those have "yes" properties.

        // Medium-fast path: Handle cases that do not require full decomposition and recomposition.
        if (!isMaybeOrNonZeroCC(norm16)) {  // minNoNo <= norm16 < minMaybeYes
            if (!doCompose) {
                return FALSE;
            }
            // Fast path for mapping a character that is immediately surrounded by boundaries.
            // In this case, we need not decompose around the current character.
            if (isDecompNoAlgorithmic(norm16)) {
                // Maps to a single isCompYesAndZeroCC character
                // which also implies hasCompBoundaryBefore.
                if (norm16HasCompBoundaryAfter(norm16, onlyContiguous) ||
                        hasCompBoundaryBefore(src, limit)) {
                    if (prevBoundary != prevSrc && !buffer.appendZeroCC(prevBoundary, prevSrc, errorCode)) {
                        break;
                    }
                    if(!buffer.append(mapAlgorithmic(c, norm16), 0, errorCode)) {
                        break;
                    }
                    prevBoundary = src;
                    continue;
                }
            } else if (norm16 < minNoNoCompBoundaryBefore) {
                // The mapping is comp-normalized which also implies hasCompBoundaryBefore.
                if (norm16HasCompBoundaryAfter(norm16, onlyContiguous) ||
                        hasCompBoundaryBefore(src, limit)) {
                    if (prevBoundary != prevSrc && !buffer.appendZeroCC(prevBoundary, prevSrc, errorCode)) {
                        break;
                    }
                    const UChar *mapping = reinterpret_cast<const UChar *>(getMapping(norm16));
                    int32_t length = *mapping++ & MAPPING_LENGTH_MASK;
                    if(!buffer.appendZeroCC(mapping, mapping + length, errorCode)) {
                        break;
                    }
                    prevBoundary = src;
                    continue;
                }
            } else if (norm16 >= minNoNoEmpty) {
                // The current character maps to nothing.
                // Simply omit it from the output if there is a boundary before _or_ after it.
                // The character itself implies no boundaries.
                if (hasCompBoundaryBefore(src, limit) ||
                        hasCompBoundaryAfter(prevBoundary, prevSrc, onlyContiguous)) {
                    if (prevBoundary != prevSrc && !buffer.appendZeroCC(prevBoundary, prevSrc, errorCode)) {
                        break;
                    }
                    prevBoundary = src;
                    continue;
                }
            }
            // Other "noNo" type, or need to examine more text around this character:
            // Fall through to the slow path.
        } else if (isJamoVT(norm16) && prevBoundary != prevSrc) {
            UChar prev=*(prevSrc-1);
            if(c<Hangul::JAMO_T_BASE) {
                // The current character is a Jamo Vowel,
                // compose with previous Jamo L and following Jamo T.
                UChar l = (UChar)(prev-Hangul::JAMO_L_BASE);
                if(l<Hangul::JAMO_L_COUNT) {
                    if (!doCompose) {
                        return FALSE;
                    }
                    int32_t t;
                    if (src != limit &&
                            0 < (t = ((int32_t)*src - Hangul::JAMO_T_BASE)) &&
                            t < Hangul::JAMO_T_COUNT) {
                        // The next character is a Jamo T.
                        ++src;
                    } else if (hasCompBoundaryBefore(src, limit)) {
                        // No Jamo T follows, not even via decomposition.
                        t = 0;
                    } else {
                        t = -1;
                    }
                    if (t >= 0) {
                        UChar32 syllable = Hangul::HANGUL_BASE +
                            (l*Hangul::JAMO_V_COUNT + (c-Hangul::JAMO_V_BASE)) *
                            Hangul::JAMO_T_COUNT + t;
                        --prevSrc;  // Replace the Jamo L as well.
                        if (prevBoundary != prevSrc && !buffer.appendZeroCC(prevBoundary, prevSrc, errorCode)) {
                            break;
                        }
                        if(!buffer.appendBMP((UChar)syllable, 0, errorCode)) {
                            break;
                        }
                        prevBoundary = src;
                        continue;
                    }
                    // If we see L+V+x where x!=T then we drop to the slow path,
                    // decompose and recompose.
                    // This is to deal with NFKC finding normal L and V but a
                    // compatibility variant of a T.
                    // We need to either fully compose that combination here
                    // (which would complicate the code and may not work with strange custom data)
                    // or use the slow path.
                }
            } else if (Hangul::isHangulLV(prev)) {
                // The current character is a Jamo Trailing consonant,
                // compose with previous Hangul LV that does not contain a Jamo T.
                if (!doCompose) {
                    return FALSE;
                }
                UChar32 syllable = prev + c - Hangul::JAMO_T_BASE;
                --prevSrc;  // Replace the Hangul LV as well.
                if (prevBoundary != prevSrc && !buffer.appendZeroCC(prevBoundary, prevSrc, errorCode)) {
                    break;
                }
                if(!buffer.appendBMP((UChar)syllable, 0, errorCode)) {
                    break;
                }
                prevBoundary = src;
                continue;
            }
            // No matching context, or may need to decompose surrounding text first:
            // Fall through to the slow path.
        } else if (norm16 > JAMO_VT) {  // norm16 >= MIN_YES_YES_WITH_CC
            // One or more combining marks that do not combine-back:
            // Check for canonical order, copy unchanged if ok and
            // if followed by a character with a boundary-before.
            uint8_t cc = getCCFromNormalYesOrMaybe(norm16);  // cc!=0
            if (onlyContiguous /* FCC */ && getPreviousTrailCC(prevBoundary, prevSrc) > cc) {
                // Fails FCD test, need to decompose and contiguously recompose.
                if (!doCompose) {
                    return FALSE;
                }
            } else {
                // If !onlyContiguous (not FCC), then we ignore the tccc of
                // the previous character which passed the quick check "yes && ccc==0" test.
                const UChar *nextSrc;
                uint16_t n16;
                for (;;) {
                    if (src == limit) {
                        if (doCompose) {
                            buffer.appendZeroCC(prevBoundary, limit, errorCode);
                        }
                        return TRUE;
                    }
                    uint8_t prevCC = cc;
                    nextSrc = src;
                    UCPTRIE_FAST_U16_NEXT(normTrie, UCPTRIE_16, nextSrc, limit, c, n16);
                    if (n16 >= MIN_YES_YES_WITH_CC) {
                        cc = getCCFromNormalYesOrMaybe(n16);
                        if (prevCC > cc) {
                            if (!doCompose) {
                                return FALSE;
                            }
                            break;
                        }
                    } else {
                        break;
                    }
                    src = nextSrc;
                }
                // src is after the last in-order combining mark.
                // If there is a boundary here, then we continue with no change.
                if (norm16HasCompBoundaryBefore(n16)) {
                    if (isCompYesAndZeroCC(n16)) {
                        src = nextSrc;
                    }
                    continue;
                }
                // Use the slow path. There is no boundary in [prevSrc, src[.
            }
        }

        // Slow path: Find the nearest boundaries around the current character,
        // decompose and recompose.
        if (prevBoundary != prevSrc && !norm16HasCompBoundaryBefore(norm16)) {
            const UChar *p = prevSrc;
            UCPTRIE_FAST_U16_PREV(normTrie, UCPTRIE_16, prevBoundary, p, c, norm16);
            if (!norm16HasCompBoundaryAfter(norm16, onlyContiguous)) {
                prevSrc = p;
            }
        }
        if (doCompose && prevBoundary != prevSrc && !buffer.appendZeroCC(prevBoundary, prevSrc, errorCode)) {
            break;
        }
        int32_t recomposeStartIndex=buffer.length();
        // We know there is not a boundary here.
        decomposeShort(prevSrc, src, FALSE /* !stopAtCompBoundary */, onlyContiguous,
                       buffer, errorCode);
        // Decompose until the next boundary.
        src = decomposeShort(src, limit, TRUE /* stopAtCompBoundary */, onlyContiguous,
                             buffer, errorCode);
        if (U_FAILURE(errorCode)) {
            break;
        }
        if ((src - prevSrc) > INT32_MAX) {  // guard before buffer.equals()
            errorCode = U_INDEX_OUTOFBOUNDS_ERROR;
            return TRUE;
        }
        recompose(buffer, recomposeStartIndex, onlyContiguous);
        if(!doCompose) {
            if(!buffer.equals(prevSrc, src)) {
                return FALSE;
            }
            buffer.remove();
        }
        prevBoundary=src;
    }
    return TRUE;
}